

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  undefined8 *puVar1;
  NetPrivate *pNVar2;
  pointer pMVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  void *pvVar14;
  int iVar15;
  pointer piVar16;
  long lVar17;
  NetPrivate *pNVar18;
  NetPrivate *pNVar19;
  NetPrivate *__ptr;
  void *in_R8;
  pointer pMVar20;
  ulong uVar21;
  pointer pcVar22;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat local_d8;
  int local_90;
  allocator_type local_89;
  NetPrivate *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  NetPrivate *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  pointer local_48;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    pNVar18 = (NetPrivate *)&stack0xffffffffffffff78;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pNVar18,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d8);
    piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_38 = (pointer)blob_mats;
    if ((layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar16) {
      lVar17 = 0;
      uVar21 = 0;
      do {
        pNVar2 = local_88;
        pMVar20 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_38->name)->_M_impl
                  ).super__Vector_impl_data._M_start + piVar16[uVar21];
        piVar6 = *(int **)((long)&(local_88->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pNVar19 = *(NetPrivate **)((long)&local_88->opt + lVar17);
            pNVar18 = *(NetPrivate **)
                       ((long)&(local_88->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (pNVar18 == (NetPrivate *)0x0) {
              if (pNVar19 != (NetPrivate *)0x0) {
                free(pNVar19);
                pNVar18 = pNVar19;
              }
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar18->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
        puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar17);
        *(undefined8 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + lVar17) = 0;
        *(undefined8 *)((long)puVar1 + 0xc) = 0;
        *(undefined8 *)((long)puVar1 + 0x14) = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)
                 ((long)&(pNVar2->layers).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar17);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)
         ((long)&(pNVar2->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar17) = 0;
        if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
           (*pMVar20->refcount != 1)) {
          pNVar18 = (NetPrivate *)&local_d8;
          Mat::clone(&local_d8,(__fn *)pMVar20,opt->blob_allocator,(int)opt,in_R8);
          pNVar19 = local_88;
          pNVar2 = (NetPrivate *)((long)&local_88->opt + lVar17);
          if (pNVar2 != (NetPrivate *)&local_d8) {
            piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = *(int **)((long)&(local_88->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                __ptr = *(NetPrivate **)((long)&local_88->opt + lVar17);
                pNVar18 = *(NetPrivate **)
                           ((long)&(local_88->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17);
                if (pNVar18 == (NetPrivate *)0x0) {
                  if (__ptr != (NetPrivate *)0x0) {
                    free(__ptr);
                    pNVar18 = __ptr;
                  }
                }
                else {
                  (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 &pNVar18->opt)->_M_impl).super__Vector_impl_data._M_start)->
                               elempack)();
                }
              }
            }
            *(undefined8 *)
             ((long)&(pNVar19->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar17) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *(undefined8 *)
             ((long)&(pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            pNVar2->opt = (Option *)0x0;
            (pNVar2->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            puVar1 = (undefined8 *)
                     ((long)&(pNVar19->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar17);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)
             ((long)&(pNVar19->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar17) = 0;
            puVar1 = (undefined8 *)((long)&pNVar19->opt + lVar17);
            *puVar1 = local_d8.data;
            puVar1[1] = CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            *(ulong *)((long)&(pNVar19->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar17) =
                 CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
            *(int *)((long)&(pNVar19->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar17) = local_d8.elempack;
            *(Allocator **)
             ((long)&(pNVar19->layers).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar17) = local_d8.allocator;
            piVar6 = (int *)((long)&(pNVar19->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar17);
            *piVar6 = local_d8.dims;
            piVar6[1] = local_d8.w;
            piVar6[2] = local_d8.h;
            piVar6[3] = local_d8.d;
            *(int *)((long)&(pNVar19->input_blob_indexes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar17) = local_d8.c;
            *(size_t *)
             ((long)&(pNVar19->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar17) = local_d8.cstep;
          }
          piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pNVar18 = (NetPrivate *)local_d8.allocator;
              if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
                if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
                  free(local_d8.data);
                  pNVar18 = (NetPrivate *)local_d8.data;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                               &(local_d8.allocator)->_vptr_Allocator)->_M_impl).
                              super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          local_d8.cstep = 0;
          local_d8.data = (NetPrivate *)0x0;
          local_d8.refcount._0_4_ = 0;
          local_d8.refcount._4_4_ = 0;
          local_d8.elemsize._0_4_ = 0;
          local_d8.elemsize._4_4_ = 0;
          local_d8.elempack = 0;
          local_d8.dims = 0;
          local_d8.w = 0;
          local_d8.h = 0;
          local_d8.d = 0;
          local_d8.c = 0;
        }
        pNVar2 = local_88;
        if ((*(int *)((long)&(local_88->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar17) == 0) &&
           (pMVar3 = (pointer)((long)&local_88->opt + lVar17), pMVar3 != pMVar20)) {
          piVar6 = pMVar20->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = *(int **)((long)&(local_88->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar17);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pNVar19 = *(NetPrivate **)((long)&local_88->opt + lVar17);
              pNVar18 = *(NetPrivate **)
                         ((long)&(local_88->layers).
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar17);
              if (pNVar18 == (NetPrivate *)0x0) {
                if (pNVar19 != (NetPrivate *)0x0) {
                  free(pNVar19);
                  pNVar18 = pNVar19;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar18->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          puVar1 = (undefined8 *)((long)&pNVar2->opt + lVar17);
          puVar1[8] = 0;
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          puVar1[5] = 0;
          puVar1[6] = 0;
          *(undefined4 *)(puVar1 + 7) = 0;
          piVar6 = pMVar20->refcount;
          *puVar1 = pMVar20->data;
          puVar1[1] = piVar6;
          puVar1[2] = pMVar20->elemsize;
          *(int *)(puVar1 + 3) = pMVar20->elempack;
          puVar1[4] = pMVar20->allocator;
          uVar7 = *(undefined8 *)&pMVar20->h;
          puVar1[5] = *(undefined8 *)&pMVar20->dims;
          puVar1[6] = uVar7;
          *(int *)(puVar1 + 7) = pMVar20->c;
          puVar1[8] = pMVar20->cstep;
        }
        convert_layout(pNVar18,(Mat *)((long)&local_88->opt + lVar17),layer,opt);
        uVar21 = uVar21 + 1;
        piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x48;
      } while (uVar21 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)piVar16 >>
                               2));
    }
    pcVar22 = local_38;
    if ((opt->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_89);
      iVar15 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff78,&local_d8,opt);
      if (iVar15 == 0) {
        piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_90 = iVar15;
        if ((layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar16) {
          lVar17 = 0;
          uVar21 = 0;
          do {
            pvVar14 = local_d8.data;
            pMVar20 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar22->name)->
                      _M_impl).super__Vector_impl_data._M_start + piVar16[uVar21];
            if ((pointer)((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                  local_d8.data)->_M_impl).super__Vector_impl_data._M_start + lVar17
                         ) != pMVar20) {
              piVar6 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         ((long)local_d8.data + 8))->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + lVar17);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = pMVar20->refcount;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (pMVar20->allocator == (Allocator *)0x0) {
                    if (pMVar20->data != (void *)0x0) {
                      free(pMVar20->data);
                    }
                  }
                  else {
                    (*pMVar20->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar20->cstep = 0;
              pMVar20->data = (void *)0x0;
              pMVar20->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
              pMVar20->dims = 0;
              pMVar20->w = 0;
              pMVar20->h = 0;
              pMVar20->d = 0;
              pMVar20->c = 0;
              puVar1 = (undefined8 *)
                       ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar14)->
                               _M_impl).super__Vector_impl_data._M_start + lVar17);
              piVar6 = (int *)puVar1[1];
              pMVar20->data = (void *)*puVar1;
              pMVar20->refcount = piVar6;
              pMVar20->elemsize =
                   *(size_t *)
                    ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)((long)pvVar14 + 8)
                             )->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl
                            .super__Vector_impl_data._M_finish + lVar17);
              pMVar20->elempack =
                   *(int *)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                    ((long)pvVar14 + 8))->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + lVar17);
              pMVar20->allocator =
                   *(Allocator **)
                    ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             ((long)pvVar14 + 0x20))->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar17);
              puVar1 = (undefined8 *)
                       ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                ((long)pvVar14 + 0x20))->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar17);
              uVar7 = *puVar1;
              uVar8 = puVar1[1];
              pMVar20->dims = (int)uVar7;
              pMVar20->w = (int)((ulong)uVar7 >> 0x20);
              pMVar20->h = (int)uVar8;
              pMVar20->d = (int)((ulong)uVar8 >> 0x20);
              pMVar20->c = *(int *)((long)&(((vector<int,_std::allocator<int>_> *)
                                            ((long)pvVar14 + 0x38))->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_start + lVar17);
              pMVar20->cstep =
                   *(size_t *)
                    ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar14 + 0x38))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar17);
            }
            uVar21 = uVar21 + 1;
            piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x48;
          } while (uVar21 < (ulong)((long)(layer->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar16 >> 2));
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        iVar15 = local_90;
        if (local_90 == 0) goto LAB_0016e76b;
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
      }
LAB_0016e74b:
      bVar13 = false;
    }
    else {
      iVar15 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff78,opt);
      if (iVar15 != 0) goto LAB_0016e74b;
      piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_90 = iVar15;
      if ((layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar16) {
        lVar17 = 0;
        uVar21 = 0;
        do {
          pNVar18 = local_88;
          pMVar20 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar22->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar16[uVar21];
          if ((pointer)((long)&local_88->opt + lVar17) != pMVar20) {
            piVar6 = *(int **)((long)&(local_88->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = pMVar20->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (pMVar20->allocator == (Allocator *)0x0) {
                  if (pMVar20->data != (void *)0x0) {
                    free(pMVar20->data);
                  }
                }
                else {
                  (*pMVar20->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar20->cstep = 0;
            pMVar20->data = (void *)0x0;
            pMVar20->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
            pMVar20->dims = 0;
            pMVar20->w = 0;
            pMVar20->h = 0;
            pMVar20->d = 0;
            pMVar20->c = 0;
            puVar1 = (undefined8 *)((long)&pNVar18->opt + lVar17);
            piVar6 = (int *)puVar1[1];
            pMVar20->data = (void *)*puVar1;
            pMVar20->refcount = piVar6;
            pMVar20->elemsize =
                 *(size_t *)
                  ((long)&(pNVar18->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar17);
            pMVar20->elempack =
                 *(int *)((long)&(pNVar18->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage + lVar17);
            pMVar20->allocator =
                 *(Allocator **)
                  ((long)&(pNVar18->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar17);
            piVar6 = (int *)((long)&(pNVar18->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar17);
            iVar15 = piVar6[1];
            iVar4 = piVar6[2];
            iVar5 = piVar6[3];
            pMVar20->dims = *piVar6;
            pMVar20->w = iVar15;
            pMVar20->h = iVar4;
            pMVar20->d = iVar5;
            pMVar20->c = *(int *)((long)&(pNVar18->input_blob_indexes).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar17);
            pMVar20->cstep =
                 *(size_t *)
                  ((long)&(pNVar18->input_blob_indexes).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar17);
          }
          uVar21 = uVar21 + 1;
          piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x48;
        } while (uVar21 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar16 >>
                                 2));
      }
      iVar15 = local_90;
      if (local_90 != 0) goto LAB_0016e74b;
LAB_0016e76b:
      iVar15 = local_90;
      bVar13 = true;
      if ((opt->lightmode == true) &&
         (piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
         (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish != piVar16)) {
        uVar21 = 0;
        do {
          pMVar20 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar22->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar16[uVar21];
          piVar6 = pMVar20->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (pMVar20->allocator == (Allocator *)0x0) {
                if (pMVar20->data != (void *)0x0) {
                  free(pMVar20->data);
                }
              }
              else {
                (*pMVar20->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar20->cstep = 0;
          uVar21 = uVar21 + 1;
          pMVar20->data = (void *)0x0;
          pMVar20->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
          pMVar20->dims = 0;
          pMVar20->w = 0;
          pMVar20->h = 0;
          pMVar20->d = 0;
          pMVar20->c = 0;
          piVar16 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar22 = local_38;
        } while (uVar21 < (ulong)((long)(layer->bottoms).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar16 >> 2));
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
    goto joined_r0x0016e75b;
  }
  iVar4 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar20 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar4;
  local_d8.cstep = 0;
  local_d8.data = (NetPrivate *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar20->refcount != 1)) {
    this = (NetPrivate *)&stack0xffffffffffffff78;
    Mat::clone((Mat *)this,(__fn *)pMVar20,opt->blob_allocator,(int)opt,in_R8);
    piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_d8.allocator;
          if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
            free(local_d8.data);
            this = (NetPrivate *)local_d8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_d8.allocator;
        }
      }
    }
    piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
    local_d8.data = local_88;
    local_d8.refcount._0_4_ = uStack_80;
    local_d8.refcount._4_4_ = uStack_7c;
    local_d8.elemsize._0_4_ = local_78;
    local_d8.elemsize._4_4_ = uStack_74;
    local_d8.elempack = local_70;
    local_d8.allocator = (Allocator *)local_68;
    local_d8.dims = iStack_60;
    local_d8.w = iStack_5c;
    local_d8.h = iStack_58;
    local_d8.d = iStack_54;
    local_d8.c = iStack_50;
    local_d8.cstep = (size_t)local_48;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        this = local_68;
        if (local_68 == (NetPrivate *)0x0) {
          if (local_88 != (NetPrivate *)0x0) {
            free(local_88);
            this = local_88;
          }
        }
        else {
          (**(code **)&local_68->opt->openmp_blocktime)();
        }
      }
    }
    local_48 = (pointer)0x0;
    local_88 = (NetPrivate *)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
  }
  if ((local_d8.dims == 0) && (&local_d8 != pMVar20)) {
    piVar6 = pMVar20->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_d8.allocator;
          if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
            free(local_d8.data);
            this = (NetPrivate *)local_d8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_d8.allocator;
        }
      }
    }
    local_d8.data = pMVar20->data;
    local_d8.refcount._0_4_ = SUB84(pMVar20->refcount,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)pMVar20->refcount >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)pMVar20->elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(pMVar20->elemsize >> 0x20);
    local_d8.elempack = pMVar20->elempack;
    local_d8.allocator = pMVar20->allocator;
    uVar9 = pMVar20->dims;
    uVar10 = pMVar20->w;
    uVar11 = pMVar20->h;
    uVar12 = pMVar20->d;
    local_d8.c = pMVar20->c;
    local_d8.cstep = pMVar20->cstep;
    local_d8.dims = uVar9;
    local_d8.w = uVar10;
    local_d8.h = uVar11;
    local_d8.d = uVar12;
  }
  convert_layout(this,&local_d8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar15 = (*layer->_vptr_Layer[9])(layer,&local_d8,opt);
    if (iVar15 != 0) goto LAB_0016eb5e;
    pMVar20 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar5;
    if (pMVar20 != &local_d8) {
      piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = pMVar20->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar20->allocator == (Allocator *)0x0) {
            if (pMVar20->data != (void *)0x0) {
              free(pMVar20->data);
            }
          }
          else {
            (*pMVar20->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar20->cstep = 0;
      pMVar20->data = (void *)0x0;
      pMVar20->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
      pMVar20->dims = 0;
      pMVar20->w = 0;
      pMVar20->h = 0;
      pMVar20->d = 0;
      pMVar20->c = 0;
      pMVar20->data = local_d8.data;
      pMVar20->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      pMVar20->elemsize = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
      pMVar20->elempack = local_d8.elempack;
      pMVar20->allocator = local_d8.allocator;
      pMVar20->dims = local_d8.dims;
      pMVar20->w = local_d8.w;
      pMVar20->h = local_d8.h;
      pMVar20->d = local_d8.d;
      pMVar20->c = local_d8.c;
      pMVar20->cstep = local_d8.cstep;
    }
LAB_0016eccc:
    bVar13 = true;
    if (opt->lightmode == true) {
      pMVar20 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar4;
      piVar6 = pMVar20->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar20->allocator == (Allocator *)0x0) {
            if (pMVar20->data != (void *)0x0) {
              free(pMVar20->data);
            }
          }
          else {
            (*pMVar20->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar20->cstep = 0;
      pMVar20->data = (void *)0x0;
      pMVar20->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
      pMVar20->dims = 0;
      pMVar20->w = 0;
      pMVar20->h = 0;
      pMVar20->d = 0;
      pMVar20->c = 0;
    }
  }
  else {
    local_48 = (pointer)0x0;
    local_88 = (NetPrivate *)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    local_68 = (NetPrivate *)0x0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
    iVar15 = (*layer->_vptr_Layer[7])(layer,&local_d8,(pointer)&stack0xffffffffffffff78);
    if (iVar15 == 0) {
      pMVar20 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      if (pMVar20 != (pointer)&stack0xffffffffffffff78) {
        piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = pMVar20->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (pMVar20->allocator == (Allocator *)0x0) {
              if (pMVar20->data != (void *)0x0) {
                free(pMVar20->data);
              }
            }
            else {
              (*pMVar20->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar20->cstep = 0;
        pMVar20->data = (void *)0x0;
        pMVar20->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
        pMVar20->dims = 0;
        pMVar20->w = 0;
        pMVar20->h = 0;
        pMVar20->d = 0;
        pMVar20->c = 0;
        pMVar20->data = local_88;
        pMVar20->refcount = (int *)CONCAT44(uStack_7c,uStack_80);
        pMVar20->elemsize = CONCAT44(uStack_74,local_78);
        pMVar20->elempack = local_70;
        pMVar20->allocator = (Allocator *)local_68;
        pMVar20->dims = iStack_60;
        pMVar20->w = iStack_5c;
        pMVar20->h = iStack_58;
        pMVar20->d = iStack_54;
        pMVar20->c = iStack_50;
        pMVar20->cstep = (size_t)local_48;
      }
      piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_68 == (NetPrivate *)0x0) {
            if (local_88 != (NetPrivate *)0x0) {
              free(local_88);
            }
          }
          else {
            (**(code **)&local_68->opt->openmp_blocktime)();
          }
        }
      }
      local_48 = (pointer)0x0;
      local_88 = (NetPrivate *)0x0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      local_70 = 0;
      iStack_60 = 0;
      iStack_5c = 0;
      iStack_58 = 0;
      iStack_54 = 0;
      iStack_50 = 0;
      goto LAB_0016eccc;
    }
    piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_68 == (NetPrivate *)0x0) {
          if (local_88 != (NetPrivate *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)&local_68->opt->openmp_blocktime)();
        }
      }
    }
    local_48 = (pointer)0x0;
    local_88 = (NetPrivate *)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
LAB_0016eb5e:
    bVar13 = false;
  }
  piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
        if ((NetPrivate *)local_d8.data != (NetPrivate *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (**(code **)&((Option *)(local_d8.allocator)->_vptr_Allocator)->openmp_blocktime)();
      }
    }
  }
joined_r0x0016e75b:
  if (bVar13) {
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}